

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

shared_ptr<const_Map_Item> __thiscall Map::GetItem(Map *this,short uid)

{
  bool bVar1;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *this_00;
  reference psVar2;
  element_type *peVar3;
  short in_DX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined6 in_register_00000032;
  shared_ptr<const_Map_Item> sVar5;
  shared_ptr<Map_Item> local_60;
  uint local_4c;
  undefined1 local_48 [8];
  shared_ptr<Map_Item> item;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1;
  short uid_local;
  Map *this_local;
  
  this_00 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
            (CONCAT62(in_register_00000032,uid) + 0x68);
  __end1 = std::__cxx11::
           list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::begin
                     (this_00);
  item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
       end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&item.
                                                  super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    psVar2 = std::_List_const_iterator<std::shared_ptr<Map_Item>_>::operator*(&__end1);
    std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)local_48,psVar2);
    peVar3 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_48);
    bVar1 = peVar3->uid == in_DX;
    if (bVar1) {
      std::shared_ptr<Map_Item_const>::shared_ptr<Map_Item,void>
                ((shared_ptr<Map_Item_const> *)this,(shared_ptr<Map_Item> *)local_48);
    }
    local_4c = (uint)bVar1;
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_48);
    _Var4._M_pi = extraout_RDX;
    if (local_4c != 0) goto LAB_001e10d1;
    std::_List_const_iterator<std::shared_ptr<Map_Item>_>::operator++(&__end1);
  }
  std::shared_ptr<Map_Item>::shared_ptr(&local_60);
  std::shared_ptr<Map_Item_const>::shared_ptr<Map_Item,void>
            ((shared_ptr<Map_Item_const> *)this,&local_60);
  std::shared_ptr<Map_Item>::~shared_ptr(&local_60);
  _Var4._M_pi = extraout_RDX_00;
LAB_001e10d1:
  sVar5.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<const_Map_Item>)
         sVar5.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Map_Item> Map::GetItem(short uid) const
{
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == uid)
		{
			return item;
		}
	}

	return std::shared_ptr<Map_Item>();
}